

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_timer.cpp
# Opt level: O2

void __thiscall time2::operator()(time2 *this,error_code *e)

{
  ostream *poVar1;
  runtime_error *this_00;
  string local_1b0 [32];
  ostringstream oss;
  
  if (*(int *)e == 1) {
    occured2_at._0_12_ = booster::ptime::now();
    booster::aio::io_service::stop();
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar1 = std::operator<<((ostream *)&oss,"Error ");
  poVar1 = std::operator<<(poVar1,
                           "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_timer.cpp"
                          );
  poVar1 = std::operator<<(poVar1,":");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x22);
  std::operator<<(poVar1," e.value()==booster::aio::aio_error::canceled");
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this_00,local_1b0);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void operator()(booster::system::error_code const &e)
	{
		TEST(e.value()==booster::aio::aio_error::canceled);
		occured2_at = booster::ptime::now();
		srv->stop();

	}